

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

anon_class_24_3_67308ef9 *
google::protobuf::internal::ExtensionSet::
ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::AppendToList(google::protobuf::Descriptor_const*,google::protobuf::DescriptorPool_const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>*)const::__0>
          (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           begin,_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 end,anon_class_24_3_67308ef9 func)

{
  bool bVar1;
  _Self in_RDX;
  _Self in_RSI;
  anon_class_24_3_67308ef9 *in_RDI;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  anon_class_24_3_67308ef9 *this;
  Extension *ext;
  
  ext = (Extension *)&stack0x00000008;
  this = in_RDI;
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,(_Self *)&stack0xfffffffffffffff0);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>::
    operator->((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                *)0x55d9bb);
    std::
    _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>::
    operator->((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                *)0x55d9cb);
    AppendToList::anon_class_24_3_67308ef9::operator()
              ((anon_class_24_3_67308ef9 *)in_RDX._M_node,(int)((ulong)in_RSI._M_node >> 0x20),ext);
    std::
    _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>::
    operator++((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                *)this);
  }
  this->containing_type = (Descriptor *)ext->field_0;
  this->pool = *(DescriptorPool **)&ext->type;
  this->output = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  **)ext->descriptor;
  return in_RDI;
}

Assistant:

static KeyValueFunctor ForEach(Iterator begin, Iterator end,
                                 KeyValueFunctor func) {
    for (Iterator it = begin; it != end; ++it) func(it->first, it->second);
    return std::move(func);
  }